

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

bool __thiscall
Js::Phases::IsEnabled(Phases *this,Phase phase,uint sourceContextId,LocalFunctionId functionId)

{
  bool local_25;
  SourceFunctionNode local_24;
  LocalFunctionId local_1c;
  uint local_18;
  LocalFunctionId functionId_local;
  uint sourceContextId_local;
  Phase phase_local;
  Phases *this_local;
  
  local_25 = false;
  if ((this->phaseList[(int)(uint)phase].valid & 1U) != 0) {
    local_1c = functionId;
    local_18 = sourceContextId;
    functionId_local._2_2_ = phase;
    _sourceContextId_local = this;
    SourceFunctionNode::SourceFunctionNode(&local_24,sourceContextId,functionId);
    local_25 = RangeBase<Js::SourceFunctionNode>::InRange
                         (&this->phaseList[(int)(uint)phase].range.
                           super_RangeBase<Js::SourceFunctionNode>,local_24);
  }
  return local_25;
}

Assistant:

bool
    Phases::IsEnabled(Phase phase, uint sourceContextId, Js::LocalFunctionId functionId)
    {
        return  this->phaseList[(int)phase].valid &&
                this->phaseList[(int)phase].range.InRange(SourceFunctionNode(sourceContextId, functionId));
    }